

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void __thiscall
xLearn::ReaderTest_SampleFromDisk_Test::ReaderTest_SampleFromDisk_Test
          (ReaderTest_SampleFromDisk_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015a030;
  return;
}

Assistant:

TEST(ReaderTest, SampleFromDisk) { 
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_disk(lr_file, 0);
  printf("check lr\n");
  read_from_disk(ffm_file, 1);
  printf("check ffm\n");
  read_from_disk(csv_file, 2);
  printf("check csv\n");
  read_from_disk(lr_no_file, 3);
  printf("check lr\n");
  read_from_disk(ffm_no_file, 4);
  printf("check ffm\n");
  read_from_disk(lr_file_comma, 0);
  printf("check lr\n");
  read_from_disk(ffm_file_comma, 1);
  printf("check ffm\n");
  read_from_disk(csv_file_comma, 2);
  printf("check csv\n");
  read_from_disk(lr_no_file_comma, 3);
  printf("check lr\n");
  read_from_disk(ffm_no_file_comma, 4);
  printf("check ffm\n");
  // delete file
  delete_file();
}